

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTrait.h
# Opt level: O2

void __thiscall MeshLib::CFaceTrait::~CFaceTrait(CFaceTrait *this)

{
  (this->super_Trait)._vptr_Trait = (_func_int **)&PTR__Trait_0011bc70;
  std::__cxx11::string::~string((string *)&(this->super_Trait).m_string);
  return;
}

Assistant:

Point & fnormal() { return f_normal; }